

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject.cpp
# Opt level: O2

ostream * bidfx_public_api::price::subject::operator<<(ostream *os,Subject *s)

{
  ostream *poVar1;
  string local_30;
  
  Subject::ToString_abi_cxx11_(&local_30,s);
  poVar1 = std::operator<<(os,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Subject& s)
{
    return os << s.ToString();
}